

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.hpp
# Opt level: O3

void __thiscall OpenCLKernels::~OpenCLKernels(OpenCLKernels *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  cv::ocl::Kernel::~Kernel(&this->kernel_calculate_accumulated_diff);
  cv::ocl::Kernel::~Kernel(&this->kernel_calculate_filtered_diff);
  cv::ocl::Kernel::~Kernel(&this->kernel_zero_flicker_counter);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_masks);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_flicker_counter);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_similarity_levels);
  pcVar1 = (this->availability_error)._M_dataplus._M_p;
  paVar2 = &(this->availability_error).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~OpenCLKernels() = default;